

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::declareStruct
          (HlslParseContext *this,TSourceLoc *loc,TString *structName,TType *type)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  size_type sVar5;
  TVariable *this_00;
  char *pcVar6;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *pvVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  pointer pTVar8;
  undefined4 extraout_var_02;
  pointer ppVar9;
  undefined4 extraout_var_03;
  long lVar10;
  TQualifier *pTVar11;
  undefined4 extraout_var_04;
  mapped_type *pmVar12;
  TSourceLoc *s;
  TTypeList *local_128;
  _Self local_120;
  TTypeList *local_118;
  _Self local_110;
  iterator it_1;
  TTypeLoc newOutputMember;
  TTypeLoc newInputMember;
  TTypeLoc newUniformMember;
  anon_class_8_1_60e67bd8 newMember;
  anon_class_8_1_60e67bd8 inheritStruct;
  __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
  local_90;
  const_iterator member_2;
  __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
  local_80;
  const_iterator member_1;
  TTypeList *local_70;
  _Self local_68;
  iterator it;
  __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
  local_58;
  const_iterator member;
  tIoKinds newLists;
  anon_class_1_0_00000001 condAlloc;
  TVariable *userTypeDef;
  TType *type_local;
  TString *structName_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  s = loc;
  iVar3 = (*type->_vptr_TType[7])();
  if ((iVar3 != 0x10) &&
     (sVar5 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::size
                        (structName), sVar5 != 0)) {
    this_00 = (TVariable *)TSymbol::operator_new((TSymbol *)0xf8,(size_t)s);
    TVariable::TVariable(this_00,structName,type,true);
    bVar2 = TSymbolTable::insert((this->super_TParseContextBase).symbolTable,(TSymbol *)this_00);
    if (bVar2) {
      memset(&member,0,0x18);
      pvVar7 = &TType::getStruct(type)->
                super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
      local_58._M_current =
           (TTypeLoc *)
           std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::begin
                     (pvVar7);
      while( true ) {
        pvVar7 = &TType::getStruct(type)->
                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
        it._M_node = (_Base_ptr)
                     std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                     end(pvVar7);
        bVar2 = __gnu_cxx::operator!=
                          (&local_58,
                           (__normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                            *)&it);
        if (!bVar2) break;
        pTVar8 = __gnu_cxx::
                 __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                 ::operator->(&local_58);
        iVar3 = (*pTVar8->type->_vptr_TType[10])();
        bVar2 = hasUniform(this,(TQualifier *)CONCAT44(extraout_var,iVar3));
        declareStruct::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)((long)&newLists.uniform + 7),bVar2,&newLists.output);
        pTVar8 = __gnu_cxx::
                 __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                 ::operator->(&local_58);
        iVar3 = (*pTVar8->type->_vptr_TType[10])();
        bVar2 = hasInput(this,(TQualifier *)CONCAT44(extraout_var_00,iVar3));
        declareStruct::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)((long)&newLists.uniform + 7),bVar2,
                   (TTypeList **)&member);
        pTVar8 = __gnu_cxx::
                 __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                 ::operator->(&local_58);
        iVar3 = (*pTVar8->type->_vptr_TType[10])();
        bVar2 = hasOutput(this,(TQualifier *)CONCAT44(extraout_var_01,iVar3));
        declareStruct::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)((long)&newLists.uniform + 7),bVar2,&newLists.input);
        pTVar8 = __gnu_cxx::
                 __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                 ::operator->(&local_58);
        uVar4 = (*pTVar8->type->_vptr_TType[0x25])();
        if ((uVar4 & 1) != 0) {
          pTVar8 = __gnu_cxx::
                   __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                   ::operator->(&local_58);
          local_70 = TType::getStruct(pTVar8->type);
          local_68._M_node =
               (_Base_ptr)
               std::
               map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
               ::find(&(this->ioTypeMap).
                       super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                      ,&local_70);
          member_1._M_current =
               (TTypeLoc *)
               std::
               map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
               ::end(&(this->ioTypeMap).
                      super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                    );
          bVar2 = std::operator!=(&local_68,(_Self *)&member_1);
          if (bVar2) {
            ppVar9 = std::
                     _Rb_tree_iterator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>
                     ::operator->(&local_68);
            declareStruct::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)((long)&newLists.uniform + 7),
                       (ppVar9->second).uniform != (TTypeList *)0x0,&newLists.output);
            ppVar9 = std::
                     _Rb_tree_iterator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>
                     ::operator->(&local_68);
            declareStruct::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)((long)&newLists.uniform + 7),
                       (ppVar9->second).input != (TTypeList *)0x0,(TTypeList **)&member);
            ppVar9 = std::
                     _Rb_tree_iterator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>
                     ::operator->(&local_68);
            declareStruct::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)((long)&newLists.uniform + 7),
                       (ppVar9->second).output != (TTypeList *)0x0,&newLists.input);
          }
        }
        __gnu_cxx::
        __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
        ::operator++(&local_58);
      }
      if (((newLists.output == (TTypeList *)0x0) && (member._M_current == (TTypeLoc *)0x0)) &&
         (newLists.input == (TTypeList *)0x0)) {
        pvVar7 = &TType::getStruct(type)->
                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
        local_80._M_current =
             (TTypeLoc *)
             std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::begin
                       (pvVar7);
        while( true ) {
          pvVar7 = &TType::getStruct(type)->
                    super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
          member_2 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                     end(pvVar7);
          bVar2 = __gnu_cxx::operator!=(&local_80,&member_2);
          if (!bVar2) break;
          pTVar8 = __gnu_cxx::
                   __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                   ::operator->(&local_80);
          iVar3 = (*pTVar8->type->_vptr_TType[10])();
          clearUniformInputOutput(this,(TQualifier *)CONCAT44(extraout_var_02,iVar3));
          __gnu_cxx::
          __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
          ::operator++(&local_80);
        }
      }
      else {
        pvVar7 = &TType::getStruct(type)->
                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
        local_90._M_current =
             (TTypeLoc *)
             std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::begin
                       (pvVar7);
        while( true ) {
          pvVar7 = &TType::getStruct(type)->
                    super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
          inheritStruct.member =
               (const_iterator *)
               std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::end
                         (pvVar7);
          bVar2 = __gnu_cxx::operator!=
                            (&local_90,
                             (__normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                              *)&inheritStruct);
          if (!bVar2) break;
          newMember.member = &local_90;
          newUniformMember.loc._16_8_ = &local_90;
          newInputMember.loc.column = 0;
          newInputMember.loc._20_4_ = 0;
          pTVar8 = __gnu_cxx::
                   __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                   ::operator->(&local_90);
          newUniformMember.type = (TType *)(pTVar8->loc).name;
          newUniformMember.loc.name = *(TString **)&(pTVar8->loc).string;
          newUniformMember.loc.string = (pTVar8->loc).column;
          newUniformMember.loc.line = *(int *)&(pTVar8->loc).field_0x14;
          newOutputMember.loc.column = 0;
          newOutputMember.loc._20_4_ = 0;
          pTVar8 = __gnu_cxx::
                   __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                   ::operator->(&local_90);
          newInputMember.type = (TType *)(pTVar8->loc).name;
          newInputMember.loc.name = *(TString **)&(pTVar8->loc).string;
          newInputMember.loc.string = (pTVar8->loc).column;
          newInputMember.loc.line = *(int *)&(pTVar8->loc).field_0x14;
          it_1._M_node = (_Base_ptr)0x0;
          pTVar8 = __gnu_cxx::
                   __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                   ::operator->(&local_90);
          newOutputMember.type = (TType *)(pTVar8->loc).name;
          newOutputMember.loc.name = *(TString **)&(pTVar8->loc).string;
          newOutputMember.loc.string = (pTVar8->loc).column;
          newOutputMember.loc.line = *(int *)&(pTVar8->loc).field_0x14;
          pTVar8 = __gnu_cxx::
                   __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                   ::operator->(&local_90);
          uVar4 = (*pTVar8->type->_vptr_TType[0x25])();
          if ((uVar4 & 1) != 0) {
            pTVar8 = __gnu_cxx::
                     __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                     ::operator->(&local_90);
            local_118 = TType::getStruct(pTVar8->type);
            local_110._M_node =
                 (_Base_ptr)
                 std::
                 map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                 ::find(&(this->ioTypeMap).
                         super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                        ,&local_118);
            local_120._M_node =
                 (_Base_ptr)
                 std::
                 map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                 ::end(&(this->ioTypeMap).
                        super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                      );
            bVar2 = std::operator!=(&local_110,&local_120);
            if (bVar2) {
              ppVar9 = std::
                       _Rb_tree_iterator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>
                       ::operator->(&local_110);
              declareStruct::anon_class_8_1_60e67bd8::operator()
                        (&newMember,(ppVar9->second).uniform,(TTypeLoc *)&newInputMember.loc.column)
              ;
              ppVar9 = std::
                       _Rb_tree_iterator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>
                       ::operator->(&local_110);
              declareStruct::anon_class_8_1_60e67bd8::operator()
                        (&newMember,(ppVar9->second).input,(TTypeLoc *)&newOutputMember.loc.column);
              ppVar9 = std::
                       _Rb_tree_iterator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>
                       ::operator->(&local_110);
              declareStruct::anon_class_8_1_60e67bd8::operator()
                        (&newMember,(ppVar9->second).output,(TTypeLoc *)&it_1);
            }
          }
          if (newLists.output != (TTypeList *)0x0) {
            declareStruct::anon_class_8_1_60e67bd8::operator()
                      ((anon_class_8_1_60e67bd8 *)&newUniformMember.loc.column,
                       (TTypeLoc *)&newInputMember.loc.column);
            pTVar8 = __gnu_cxx::
                     __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                     ::operator->(&local_90);
            uVar4 = (*pTVar8->type->_vptr_TType[0x1c])();
            if ((uVar4 & 1) != 0) {
              pTVar8 = __gnu_cxx::
                       __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                       ::operator->(&local_90);
              iVar3 = (*pTVar8->type->_vptr_TType[10])();
              if ((uint)((ulong)*(undefined8 *)(CONCAT44(extraout_var_03,iVar3) + 8) >> 0x3d) == 0)
              {
                uVar1 = *(ulong *)&(this->globalUniformDefaults).field_0x8;
                lVar10 = (**(code **)(*(long *)newInputMember.loc._16_8_ + 0x50))();
                *(ulong *)(lVar10 + 8) =
                     *(ulong *)(lVar10 + 8) & 0x1fffffffffffffff | uVar1 & 0xe000000000000000;
              }
            }
            pTVar11 = (TQualifier *)(**(code **)(*(long *)newInputMember.loc._16_8_ + 0x50))();
            correctUniform(this,pTVar11);
            std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::push_back
                      (&(newLists.output)->
                        super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                       ,(value_type *)&newInputMember.loc.column);
          }
          if (member._M_current != (TTypeLoc *)0x0) {
            declareStruct::anon_class_8_1_60e67bd8::operator()
                      ((anon_class_8_1_60e67bd8 *)&newUniformMember.loc.column,
                       (TTypeLoc *)&newOutputMember.loc.column);
            pTVar11 = (TQualifier *)(**(code **)(*(long *)newOutputMember.loc._16_8_ + 0x50))();
            correctInput(this,pTVar11);
            std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::push_back
                      ((vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *)
                       member._M_current,(value_type *)&newOutputMember.loc.column);
          }
          if (newLists.input != (TTypeList *)0x0) {
            declareStruct::anon_class_8_1_60e67bd8::operator()
                      ((anon_class_8_1_60e67bd8 *)&newUniformMember.loc.column,(TTypeLoc *)&it_1);
            pTVar11 = (TQualifier *)(**(code **)(*(long *)it_1._M_node + 0x50))();
            correctOutput(this,pTVar11);
            std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::push_back
                      (&(newLists.input)->
                        super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                       ,(value_type *)&it_1);
          }
          pTVar8 = __gnu_cxx::
                   __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                   ::operator->(&local_90);
          iVar3 = (*pTVar8->type->_vptr_TType[10])();
          clearUniformInputOutput(this,(TQualifier *)CONCAT44(extraout_var_04,iVar3));
          __gnu_cxx::
          __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
          ::operator++(&local_90);
        }
        local_128 = TType::getStruct(type);
        pmVar12 = std::
                  map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                  ::operator[](&(this->ioTypeMap).
                                super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                               ,&local_128);
        pmVar12->input = (TTypeList *)member._M_current;
        pmVar12->output = newLists.input;
        pmVar12->uniform = newLists.output;
      }
    }
    else {
      pcVar6 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         (structName);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"redefinition",pcVar6,"struct");
    }
  }
  return;
}

Assistant:

void HlslParseContext::declareStruct(const TSourceLoc& loc, TString& structName, TType& type)
{
    // If it was named, which means the type can be reused later, add
    // it to the symbol table.  (Unless it's a block, in which
    // case the name is not a type.)
    if (type.getBasicType() == EbtBlock || structName.size() == 0)
        return;

    TVariable* userTypeDef = new TVariable(&structName, type, true);
    if (! symbolTable.insert(*userTypeDef)) {
        error(loc, "redefinition", structName.c_str(), "struct");
        return;
    }

    // See if we need IO aliases for the structure typeList

    const auto condAlloc = [](bool pred, TTypeList*& list) {
        if (pred && list == nullptr)
            list = new TTypeList;
    };

    tIoKinds newLists = { nullptr, nullptr, nullptr }; // allocate for each kind found
    for (auto member = type.getStruct()->begin(); member != type.getStruct()->end(); ++member) {
        condAlloc(hasUniform(member->type->getQualifier()), newLists.uniform);
        condAlloc(  hasInput(member->type->getQualifier()), newLists.input);
        condAlloc( hasOutput(member->type->getQualifier()), newLists.output);

        if (member->type->isStruct()) {
            auto it = ioTypeMap.find(member->type->getStruct());
            if (it != ioTypeMap.end()) {
                condAlloc(it->second.uniform != nullptr, newLists.uniform);
                condAlloc(it->second.input   != nullptr, newLists.input);
                condAlloc(it->second.output  != nullptr, newLists.output);
            }
        }
    }
    if (newLists.uniform == nullptr &&
        newLists.input   == nullptr &&
        newLists.output  == nullptr) {
        // Won't do any IO caching, clear up the type and get out now.
        for (auto member = type.getStruct()->begin(); member != type.getStruct()->end(); ++member)
            clearUniformInputOutput(member->type->getQualifier());
        return;
    }

    // We have IO involved.

    // Make a pure typeList for the symbol table, and cache side copies of IO versions.
    for (auto member = type.getStruct()->begin(); member != type.getStruct()->end(); ++member) {
        const auto inheritStruct = [&](TTypeList* s, TTypeLoc& ioMember) {
            if (s != nullptr) {
                ioMember.type = new TType;
                ioMember.type->shallowCopy(*member->type);
                ioMember.type->setStruct(s);
            }
        };
        const auto newMember = [&](TTypeLoc& m) {
            if (m.type == nullptr) {
                m.type = new TType;
                m.type->shallowCopy(*member->type);
            }
        };

        TTypeLoc newUniformMember = { nullptr, member->loc };
        TTypeLoc newInputMember   = { nullptr, member->loc };
        TTypeLoc newOutputMember  = { nullptr, member->loc };
        if (member->type->isStruct()) {
            // swap in an IO child if there is one
            auto it = ioTypeMap.find(member->type->getStruct());
            if (it != ioTypeMap.end()) {
                inheritStruct(it->second.uniform, newUniformMember);
                inheritStruct(it->second.input,   newInputMember);
                inheritStruct(it->second.output,  newOutputMember);
            }
        }
        if (newLists.uniform) {
            newMember(newUniformMember);

            // inherit default matrix layout (changeable via #pragma pack_matrix), if none given.
            if (member->type->isMatrix() && member->type->getQualifier().layoutMatrix == ElmNone)
                newUniformMember.type->getQualifier().layoutMatrix = globalUniformDefaults.layoutMatrix;

            correctUniform(newUniformMember.type->getQualifier());
            newLists.uniform->push_back(newUniformMember);
        }
        if (newLists.input) {
            newMember(newInputMember);
            correctInput(newInputMember.type->getQualifier());
            newLists.input->push_back(newInputMember);
        }
        if (newLists.output) {
            newMember(newOutputMember);
            correctOutput(newOutputMember.type->getQualifier());
            newLists.output->push_back(newOutputMember);
        }

        // make original pure
        clearUniformInputOutput(member->type->getQualifier());
    }
    ioTypeMap[type.getStruct()] = newLists;
}